

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_psbt_to_bytes(wally_psbt *psbt,uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  size_t *psVar1;
  wally_psbt_input *pwVar2;
  long lVar3;
  int iVar4;
  uchar *bytes;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  size_t remaining;
  uchar *ptr;
  size_t max;
  uchar *cursor;
  wally_psbt *local_470;
  wally_psbt_output *local_468;
  ulong local_460;
  ulong local_458;
  size_t local_450;
  size_t *local_448;
  size_t is_elements;
  uchar buff [1024];
  
  iVar4 = -2;
  if (((written != (size_t *)0x0) && (*written = 0, flags == 0)) &&
     (max = len, cursor = bytes_out, iVar4 = wally_psbt_is_elements(psbt,&is_elements), iVar4 == 0))
  {
    push_bytes(&cursor,&max,psbt,5);
    push_psbt_key(&cursor,&max,0,(void *)0x0,0);
    iVar4 = push_length_and_tx(&cursor,&max,psbt->tx,0xc);
    if (iVar4 == 0) {
      local_468 = (wally_psbt_output *)is_elements;
      local_470 = psbt;
      local_450 = len;
      local_448 = written;
      if (psbt->version != 0) {
        push_psbt_key(&cursor,&max,0xfb,(void *)0x0,0);
        push_varint(&cursor,&max,4);
        push_le32(&cursor,&max,local_470->version);
      }
      push_map(&cursor,&max,&local_470->unknowns);
      lVar7 = 0;
      push_u8(&cursor,&max,'\0');
      uVar6 = 0;
      while (uVar6 < local_470->num_inputs) {
        pwVar2 = local_470->inputs;
        if (*(long *)((long)&pwVar2->utxo + lVar7) != 0) {
          push_psbt_key(&cursor,&max,0,(void *)0x0,0);
          iVar4 = push_length_and_tx(&cursor,&max,*(wally_tx **)((long)&pwVar2->utxo + lVar7),1);
          if (iVar4 != 0) {
            return iVar4;
          }
        }
        lVar3 = *(long *)((long)&pwVar2->witness_utxo + lVar7);
        local_460 = uVar6;
        if (local_468 == (wally_psbt_output *)0x0) {
          if (lVar3 != 0) {
            ptr = (uchar *)0x32;
            remaining = (size_t)buff;
            push_psbt_key(&cursor,&max,1,(void *)0x0,0);
            push_le64((uchar **)&remaining,(size_t *)&ptr,
                      **(uint64_t **)((long)&pwVar2->witness_utxo + lVar7));
            lVar3 = *(long *)((long)&pwVar2->witness_utxo + lVar7);
            push_varbuff((uchar **)&remaining,(size_t *)&ptr,*(uchar **)(lVar3 + 8),
                         *(size_t *)(lVar3 + 0x10));
            if (remaining == 0) {
              return -2;
            }
            push_varbuff(&cursor,&max,buff,remaining - (long)buff);
          }
        }
        else if (lVar3 != 0) {
          remaining = *(long *)(lVar3 + 0x10) +
                      *(long *)(lVar3 + 0x48) + (ulong)(*(long *)(lVar3 + 0x48) == 0) +
                      *(long *)(lVar3 + 0x38) + (ulong)(*(long *)(lVar3 + 0x38) == 0) +
                      *(long *)(lVar3 + 0x28) + (ulong)(*(long *)(lVar3 + 0x28) == 0) + 1;
          bytes = buff;
          local_458 = remaining;
          if ((0x400 < remaining) &&
             (bytes = (uchar *)wally_malloc(remaining), bytes == (uchar *)0x0)) {
            return -3;
          }
          ptr = bytes;
          push_psbt_key(&cursor,&max,1,(void *)0x0,0);
          push_elements_bytes(&ptr,&remaining,*(uchar **)(lVar3 + 0x20),*(size_t *)(lVar3 + 0x28));
          push_elements_bytes(&ptr,&remaining,*(uchar **)(lVar3 + 0x30),*(size_t *)(lVar3 + 0x38));
          push_elements_bytes(&ptr,&remaining,*(uchar **)(lVar3 + 0x40),*(size_t *)(lVar3 + 0x48));
          push_varbuff(&ptr,&remaining,*(uchar **)(lVar3 + 8),*(size_t *)(lVar3 + 0x10));
          uVar6 = local_458;
          if (remaining == 0) {
            push_varbuff(&cursor,&max,bytes,local_458);
          }
          if (bytes != buff) {
            clear_and_free(bytes,uVar6);
          }
          if (remaining != 0) {
            return -1;
          }
        }
        push_typed_map(&cursor,&max,2,(wally_map *)((long)&(pwVar2->signatures).items + lVar7));
        if (*(int *)((long)&pwVar2->sighash + lVar7) != 0) {
          push_psbt_key(&cursor,&max,3,(void *)0x0,0);
          push_varint(&cursor,&max,4);
          push_le32(&cursor,&max,*(uint32_t *)((long)&pwVar2->sighash + lVar7));
        }
        push_typed_varbuff(&cursor,&max,4,*(uchar **)((long)&pwVar2->redeem_script + lVar7),
                           *(size_t *)((long)&pwVar2->redeem_script_len + lVar7));
        push_typed_varbuff(&cursor,&max,5,*(uchar **)((long)&pwVar2->witness_script + lVar7),
                           *(size_t *)((long)&pwVar2->witness_script_len + lVar7));
        push_typed_map(&cursor,&max,6,(wally_map *)((long)&(pwVar2->keypaths).items + lVar7));
        push_typed_varbuff(&cursor,&max,7,*(uchar **)((long)&pwVar2->final_scriptsig + lVar7),
                           *(size_t *)((long)&pwVar2->final_scriptsig_len + lVar7));
        if (*(long *)((long)&pwVar2->final_witness + lVar7) != 0) {
          buff[0] = '\0';
          buff[1] = '\0';
          buff[2] = '\0';
          buff[3] = '\0';
          buff[4] = '\0';
          buff[5] = '\0';
          buff[6] = '\0';
          buff[7] = '\0';
          push_psbt_key(&cursor,&max,8,(void *)0x0,0);
          push_witness_stack((uchar **)0x0,(size_t *)buff,
                             *(wally_tx_witness_stack **)((long)&pwVar2->final_witness + lVar7));
          push_varint(&cursor,&max,buff._0_8_);
          push_witness_stack(&cursor,&max,
                             *(wally_tx_witness_stack **)((long)&pwVar2->final_witness + lVar7));
        }
        if (*(int *)((long)&pwVar2->has_value + lVar7) != 0) {
          push_elements_key(&cursor,&max,0);
          push_varint(&cursor,&max,8);
          push_le64(&cursor,&max,*(uint64_t *)((long)&pwVar2->value + lVar7));
        }
        push_elements_varbuff
                  (&cursor,&max,1,*(uchar **)((long)&pwVar2->vbf + lVar7),
                   *(size_t *)((long)&pwVar2->vbf_len + lVar7));
        push_elements_varbuff
                  (&cursor,&max,2,*(uchar **)((long)&pwVar2->asset + lVar7),
                   *(size_t *)((long)&pwVar2->asset_len + lVar7));
        push_elements_varbuff
                  (&cursor,&max,3,*(uchar **)((long)&pwVar2->abf + lVar7),
                   *(size_t *)((long)&pwVar2->abf_len + lVar7));
        if (*(long *)((long)&pwVar2->pegin_tx + lVar7) != 0) {
          push_elements_key(&cursor,&max,4);
          iVar4 = push_length_and_tx(&cursor,&max,*(wally_tx **)((long)&pwVar2->pegin_tx + lVar7),1)
          ;
          if (iVar4 != 0) {
            return iVar4;
          }
        }
        push_elements_varbuff
                  (&cursor,&max,5,*(uchar **)((long)&pwVar2->txoutproof + lVar7),
                   *(size_t *)((long)&pwVar2->txoutproof_len + lVar7));
        push_elements_varbuff
                  (&cursor,&max,6,*(uchar **)((long)&pwVar2->genesis_blockhash + lVar7),
                   *(size_t *)((long)&pwVar2->genesis_blockhash_len + lVar7));
        push_elements_varbuff
                  (&cursor,&max,7,*(uchar **)((long)&pwVar2->claim_script + lVar7),
                   *(size_t *)((long)&pwVar2->claim_script_len + lVar7));
        push_map(&cursor,&max,(wally_map *)((long)&(pwVar2->unknowns).items + lVar7));
        push_u8(&cursor,&max,'\0');
        lVar7 = lVar7 + 0x110;
        uVar6 = local_460 + 1;
      }
      lVar7 = 200;
      for (local_460 = 0; local_460 < local_470->num_outputs; local_460 = local_460 + 1) {
        local_468 = local_470->outputs;
        psVar1 = (size_t *)((long)&local_468->redeem_script + lVar7);
        push_typed_varbuff(&cursor,&max,0,(uchar *)psVar1[-0x19],psVar1[-0x18]);
        push_typed_varbuff(&cursor,&max,1,(uchar *)psVar1[-0x17],psVar1[-0x16]);
        push_typed_map(&cursor,&max,2,(wally_map *)(psVar1 + -0x15));
        push_elements_varbuff(&cursor,&max,0,(uchar *)psVar1[-0xd],psVar1[-0xc]);
        push_elements_varbuff(&cursor,&max,1,(uchar *)psVar1[-0xb],psVar1[-10]);
        push_elements_varbuff(&cursor,&max,2,(uchar *)psVar1[-9],psVar1[-8]);
        push_elements_varbuff(&cursor,&max,3,(uchar *)psVar1[-7],psVar1[-6]);
        push_elements_varbuff(&cursor,&max,4,(uchar *)psVar1[-3],psVar1[-2]);
        push_elements_varbuff(&cursor,&max,5,(uchar *)psVar1[-1],*psVar1);
        push_elements_varbuff(&cursor,&max,6,(uchar *)psVar1[-0xf],psVar1[-0xe]);
        push_elements_varbuff(&cursor,&max,7,(uchar *)psVar1[-5],psVar1[-4]);
        push_map(&cursor,&max,(wally_map *)((long)local_468 + lVar7 + -0x90));
        push_u8(&cursor,&max,'\0');
        lVar7 = lVar7 + 0xd0;
      }
      sVar5 = -max;
      if (cursor == (uchar *)0x0) {
        sVar5 = max;
      }
      *local_448 = sVar5 + local_450;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int wally_psbt_to_bytes(const struct wally_psbt *psbt, uint32_t flags,
                        unsigned char *bytes_out, size_t len,
                        size_t *written)
{
    unsigned char *cursor = bytes_out;
    size_t max = len, i, is_elements;
    uint32_t tx_flags;
    int ret;

    if (written)
        *written = 0;

    if (flags != 0 || !written)
        return WALLY_EINVAL;

    if ((ret = wally_psbt_is_elements(psbt, &is_elements)) != WALLY_OK)
        return ret;

    tx_flags = is_elements ? WALLY_TX_FLAG_USE_ELEMENTS : 0;
    push_bytes(&cursor, &max, psbt->magic, sizeof(psbt->magic));

    /* Global tx */
    push_psbt_key(&cursor, &max, PSBT_GLOBAL_UNSIGNED_TX, NULL, 0);
    ret = push_length_and_tx(&cursor, &max, psbt->tx,
                             WALLY_TX_FLAG_ALLOW_PARTIAL | WALLY_TX_FLAG_PRE_BIP144);
    if (ret != WALLY_OK)
        return ret;

    /* version */
    if (psbt->version > 0) {
        push_psbt_key(&cursor, &max, PSBT_GLOBAL_VERSION, NULL, 0);
        push_varint(&cursor, &max, sizeof(uint32_t));
        push_le32(&cursor, &max, psbt->version);
    }

    /* Unknowns */
    push_map(&cursor, &max, &psbt->unknowns);

    /* Separator */
    push_u8(&cursor, &max, PSBT_SEPARATOR);

    /* Push each input and output */
    for (i = 0; i < psbt->num_inputs; ++i) {
        const struct wally_psbt_input *input = &psbt->inputs[i];
        if ((ret = push_psbt_input(&cursor, &max, tx_flags, input)) != WALLY_OK)
            return ret;
    }
    for (i = 0; i < psbt->num_outputs; ++i) {
        const struct wally_psbt_output *output = &psbt->outputs[i];
        if ((ret = push_psbt_output(&cursor, &max, output)) != WALLY_OK)
            return ret;
    }

    if (cursor == NULL) {
        /* Once cursor is NULL, max holds how many bytes we needed */
        *written = len + max;
    } else {
        *written = len - max;
    }

    return WALLY_OK;
}